

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetItemDefaultFocus(void)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  
  pIVar4 = GImGui;
  if ((((GImGui->CurrentWindow->Appearing == true) &&
       (pIVar3 = GImGui->NavWindow, pIVar3 == GImGui->CurrentWindow->RootWindowForNav)) &&
      ((GImGui->NavInitRequest != false || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (pIVar3->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar4->NavInitResultId = (pIVar3->DC).LastItemId;
    IVar1 = (pIVar3->DC).LastItemRect.Min;
    IVar2 = (pIVar3->DC).LastItemRect.Max;
    fVar6 = (pIVar3->Pos).x;
    fVar7 = (pIVar3->Pos).y;
    (pIVar4->NavInitResultRectRel).Min.x = IVar1.x - fVar6;
    (pIVar4->NavInitResultRectRel).Min.y = IVar1.y - fVar7;
    (pIVar4->NavInitResultRectRel).Max.x = IVar2.x - fVar6;
    (pIVar4->NavInitResultRectRel).Max.y = IVar2.y - fVar7;
    NavUpdateAnyRequestFlag();
    bVar5 = IsItemVisible();
    if (!bVar5) {
      SetScrollHere(0.5);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow == window->RootWindowForNav && (g.NavInitRequest || g.NavInitResultId != 0) && g.NavLayer == g.NavWindow->DC.NavLayerCurrent)
    {
        g.NavInitRequest = false;
        g.NavInitResultId = g.NavWindow->DC.LastItemId;
        g.NavInitResultRectRel = ImRect(g.NavWindow->DC.LastItemRect.Min - g.NavWindow->Pos, g.NavWindow->DC.LastItemRect.Max - g.NavWindow->Pos);
        NavUpdateAnyRequestFlag();
        if (!IsItemVisible())
            SetScrollHere();
    }
}